

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*>::
emplaceRealloc<slang::syntax::ConfigInstanceIdentifierSyntax*>
          (SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *this,pointer pos,
          ConfigInstanceIdentifierSyntax **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator ppCVar4;
  long lVar5;
  pointer ppCVar6;
  EVP_PKEY_CTX *ctx;
  undefined8 *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  ConfigInstanceIdentifierSyntax **in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::max_size
                    ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)0x25d2cb);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::calculateGrowth
                    (in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  ppCVar4 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::begin(in_RDI);
  lVar5 = (long)__last - (long)ppCVar4;
  ppCVar6 = (pointer)operator_new(0x25d32a);
  ppCVar6[lVar5 >> 3] = (ConfigInstanceIdentifierSyntax *)*in_RDX;
  ppCVar4 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::end(in_RDI);
  if (in_RSI == ppCVar4) {
    ppCVar4 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::begin(in_RDI);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::end(in_RDI);
    std::
    uninitialized_move<slang::syntax::ConfigInstanceIdentifierSyntax**,slang::syntax::ConfigInstanceIdentifierSyntax**>
              (in_RSI,__last,ppCVar4);
  }
  else {
    SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::begin(in_RDI);
    std::
    uninitialized_move<slang::syntax::ConfigInstanceIdentifierSyntax**,slang::syntax::ConfigInstanceIdentifierSyntax**>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::end(in_RDI);
    std::
    uninitialized_move<slang::syntax::ConfigInstanceIdentifierSyntax**,slang::syntax::ConfigInstanceIdentifierSyntax**>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::cleanup(in_RDI,ctx);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = ppCVar6;
  return ppCVar6 + (lVar5 >> 3);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}